

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts3SelectDoctotal(Fts3Table *pTab,sqlite3_stmt **ppStmt)

{
  int iVar1;
  int iVar2;
  sqlite3_stmt *pStmt;
  long in_FS_OFFSET;
  sqlite3_stmt *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = (sqlite3_stmt *)0x0;
  iVar1 = fts3SqlStmt(pTab,0x16,&local_28,(sqlite3_value **)0x0);
  pStmt = local_28;
  if (iVar1 == 0) {
    iVar1 = 0;
    sqlite3_bind_int64(local_28,1,0);
    iVar2 = sqlite3_step(pStmt);
    if ((iVar2 != 100) || (iVar2 = sqlite3_column_type(pStmt,0), iVar2 != 4)) {
      iVar2 = sqlite3_reset(pStmt);
      iVar1 = 0x10b;
      if (iVar2 != 0) {
        iVar1 = iVar2;
      }
      pStmt = (sqlite3_stmt *)0x0;
    }
  }
  *ppStmt = pStmt;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3SelectDoctotal(
  Fts3Table *pTab,                /* Fts3 table handle */
  sqlite3_stmt **ppStmt           /* OUT: Statement handle */
){
  sqlite3_stmt *pStmt = 0;
  int rc;
  rc = fts3SqlStmt(pTab, SQL_SELECT_STAT, &pStmt, 0);
  if( rc==SQLITE_OK ){
    sqlite3_bind_int(pStmt, 1, FTS_STAT_DOCTOTAL);
    if( sqlite3_step(pStmt)!=SQLITE_ROW
     || sqlite3_column_type(pStmt, 0)!=SQLITE_BLOB
    ){
      rc = sqlite3_reset(pStmt);
      if( rc==SQLITE_OK ) rc = FTS_CORRUPT_VTAB;
      pStmt = 0;
    }
  }
  *ppStmt = pStmt;
  return rc;
}